

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::evaluation_results::merge
          (evaluation_results *this,evaluation_results *results)

{
  range index_range_00;
  bool bVar1;
  long in_RSI;
  __normal_iterator<const_jsoncons::jsonschema::range_*,_std::vector<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  range index_range;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  range_collection *__range2_1;
  value_type *name;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  value_type *in_stack_ffffffffffffff88;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_jsoncons::jsonschema::range_*,_std::vector<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>_>
  local_50;
  long local_48;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_40;
  undefined1 local_38;
  reference local_30;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_20 [2];
  long local_10;
  
  local_10 = in_RSI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::__detail::
               _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                            *)0x756f48);
    pVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_40._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_38 = pVar2.second;
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)in_RDI);
  }
  local_48 = local_10 + 0x38;
  local_50._M_current =
       (range *)range_collection::begin((range_collection *)in_stack_ffffffffffffff78);
  range_collection::end((range_collection *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_jsoncons::jsonschema::range_*,_std::vector<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>_>
                               *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_jsoncons::jsonschema::range_*,_std::vector<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>_>
    ::operator*(&local_50);
    index_range_00.end_ = (size_t)in_RDI;
    index_range_00.start_ = (size_t)in_stack_ffffffffffffff78;
    range_collection::insert((range_collection *)0x756ff9,index_range_00);
    __gnu_cxx::
    __normal_iterator<const_jsoncons::jsonschema::range_*,_std::vector<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>_>
    ::operator++(&local_50);
  }
  return;
}

Assistant:

void merge(const evaluation_results& results)
        {
            for (auto&& name : results.evaluated_properties)
            {
                evaluated_properties.insert(name);
            }
            for (auto index_range : results.evaluated_items)
            {
                evaluated_items.insert(index_range);
            }
        }